

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsmJsByteCodeWriter.cpp
# Opt level: O1

bool __thiscall
Js::AsmJsByteCodeWriter::TryWriteAsmSimdTypedArr<Js::LayoutSizePolicy<(Js::LayoutSize)0>>
          (AsmJsByteCodeWriter *this,OpCodeAsmJs op,RegSlot value,uint32 slotIndex,uint8 dataWidth,
          ViewType viewType,uint32 offset)

{
  Data *this_00;
  uint *puVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  uint32 local_2b;
  undefined1 local_27;
  ViewType local_26;
  uint8 local_25;
  undefined1 uStack_24;
  OpLayoutT_AsmSimdTypedArr<Js::LayoutSizePolicy<(Js::LayoutSize)0>_> layout;
  
  if (((DAT_015b5fbd == '\0') && (DAT_015b5fbc == '\0')) &&
     (local_27 = (undefined1)value, value < 0x100)) {
    _uStack_24 = offset;
    local_2b = slotIndex;
    local_26 = viewType;
    local_25 = dataWidth;
    bVar3 = OpCodeUtilAsmJs::IsValidByteCodeOpcode(op);
    if (!bVar3) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar4 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/AsmJsByteCodeWriter.cpp"
                                  ,0x11,"(OpCodeUtilAsmJs::IsValidByteCodeOpcode(op))",
                                  "OpCodeUtilAsmJs::IsValidByteCodeOpcode(op)");
      if (!bVar3) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar4 = 0;
    }
    this_00 = &(this->super_ByteCodeWriter).m_byteCodeData;
    ByteCodeWriter::Data::EncodeOpCode<(Js::LayoutSize)0>(this_00,op,&this->super_ByteCodeWriter);
    if ((ushort)(op - StartCall) < 0xfff8) {
      puVar1 = &(this->super_ByteCodeWriter).m_byteCodeWithoutLDACount;
      *puVar1 = *puVar1 + 1;
    }
    ByteCodeWriter::IncreaseByteCodeCount(&this->super_ByteCodeWriter);
    ByteCodeWriter::Data::Write(this_00,&local_2b,0xb);
    bVar3 = true;
  }
  else {
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool AsmJsByteCodeWriter::TryWriteAsmSimdTypedArr(OpCodeAsmJs op, RegSlot value, uint32 slotIndex, uint8 dataWidth, ArrayBufferView::ViewType viewType, uint32 offset)
    {
        OpLayoutT_AsmSimdTypedArr<SizePolicy> layout;
        if (SizePolicy::Assign(layout.Value, value) && SizePolicy::template Assign<ArrayBufferView::ViewType>(layout.ViewType, viewType)
            && SizePolicy::Assign(layout.SlotIndex, slotIndex) && SizePolicy::template Assign<int8>(layout.DataWidth, dataWidth) && SizePolicy::Assign(layout.Offset, offset))
        {
            m_byteCodeData.EncodeT<SizePolicy::LayoutEnum>(op, &layout, sizeof(layout), this);
            return true;
        }
        return false;
    }